

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

void __thiscall tinyobj::MaterialFileReader::~MaterialFileReader(MaterialFileReader *this)

{
  ~MaterialFileReader(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~MaterialFileReader() {}